

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int walIndexTryHdr(Wal *pWal,int *pChanged)

{
  WalIndexHdr *__s1;
  u16 uVar1;
  u32 *puVar2;
  int iVar3;
  int iVar4;
  ulong uVar5;
  int iVar6;
  long in_FS_OFFSET;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  undefined8 uStack_30;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  puVar2 = *pWal->apWiData;
  local_58 = *(undefined8 *)puVar2;
  uStack_50 = *(undefined8 *)(puVar2 + 2);
  local_48 = *(undefined8 *)(puVar2 + 4);
  uStack_40 = *(undefined8 *)(puVar2 + 6);
  local_38 = *(undefined8 *)(puVar2 + 8);
  uStack_30 = *(undefined8 *)(puVar2 + 10);
  if (pWal->exclusiveMode != '\x02') {
    (*pWal->pDbFd->pMethods->xShmBarrier)(pWal->pDbFd);
  }
  local_88 = *(undefined8 *)(puVar2 + 0xc);
  uStack_80 = *(undefined8 *)(puVar2 + 0xe);
  local_78 = *(undefined8 *)(puVar2 + 0x10);
  uStack_70 = *(undefined8 *)(puVar2 + 0x12);
  local_68 = *(undefined8 *)(puVar2 + 0x14);
  uStack_60 = *(undefined8 *)(puVar2 + 0x16);
  iVar3 = bcmp(&local_58,&local_88,0x30);
  iVar4 = 1;
  if ((iVar3 == 0) && (uStack_50._4_1_ != '\0')) {
    iVar3 = 0;
    uVar5 = 0xfffffffffffffff8;
    iVar6 = 0;
    do {
      iVar6 = iVar6 + iVar3 + *(int *)((long)&uStack_50 + uVar5);
      iVar3 = iVar3 + *(int *)((long)&uStack_50 + uVar5 + 4) + iVar6;
      uVar5 = uVar5 + 8;
    } while (uVar5 < 0x20);
    if ((iVar6 == (int)uStack_30) && (iVar3 == uStack_30._4_4_)) {
      __s1 = &pWal->hdr;
      iVar3 = bcmp(__s1,&local_58,0x30);
      iVar4 = 0;
      if (iVar3 != 0) {
        *pChanged = 1;
        *(undefined8 *)(pWal->hdr).aSalt = local_38;
        *(undefined8 *)(pWal->hdr).aCksum = uStack_30;
        (pWal->hdr).mxFrame = (undefined4)local_48;
        (pWal->hdr).nPage = local_48._4_4_;
        *(undefined8 *)(pWal->hdr).aFrameCksum = uStack_40;
        __s1->iVersion = (undefined4)local_58;
        __s1->unused = local_58._4_4_;
        (pWal->hdr).iChange = (undefined4)uStack_50;
        (pWal->hdr).isInit = uStack_50._4_1_;
        (pWal->hdr).bigEndCksum = uStack_50._5_1_;
        (pWal->hdr).szPage = uStack_50._6_2_;
        uVar1 = (pWal->hdr).szPage;
        pWal->szPage = CONCAT22(uVar1,uVar1) & 0x1fe00;
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return iVar4;
  }
  __stack_chk_fail();
}

Assistant:

static SQLITE_NO_TSAN int walIndexTryHdr(Wal *pWal, int *pChanged){
  u32 aCksum[2];                  /* Checksum on the header content */
  WalIndexHdr h1, h2;             /* Two copies of the header content */
  WalIndexHdr volatile *aHdr;     /* Header in shared memory */

  /* The first page of the wal-index must be mapped at this point. */
  assert( pWal->nWiData>0 && pWal->apWiData[0] );

  /* Read the header. This might happen concurrently with a write to the
  ** same area of shared memory on a different CPU in a SMP,
  ** meaning it is possible that an inconsistent snapshot is read
  ** from the file. If this happens, return non-zero.
  **
  ** tag-20200519-1:
  ** There are two copies of the header at the beginning of the wal-index.
  ** When reading, read [0] first then [1].  Writes are in the reverse order.
  ** Memory barriers are used to prevent the compiler or the hardware from
  ** reordering the reads and writes.  TSAN and similar tools can sometimes
  ** give false-positive warnings about these accesses because the tools do not
  ** account for the double-read and the memory barrier. The use of mutexes
  ** here would be problematic as the memory being accessed is potentially
  ** shared among multiple processes and not all mutex implementations work
  ** reliably in that environment.
  */
  aHdr = walIndexHdr(pWal);
  memcpy(&h1, (void *)&aHdr[0], sizeof(h1)); /* Possible TSAN false-positive */
  walShmBarrier(pWal);
  memcpy(&h2, (void *)&aHdr[1], sizeof(h2));

  if( memcmp(&h1, &h2, sizeof(h1))!=0 ){
    return 1;   /* Dirty read */
  }
  if( h1.isInit==0 ){
    return 1;   /* Malformed header - probably all zeros */
  }
  walChecksumBytes(1, (u8*)&h1, sizeof(h1)-sizeof(h1.aCksum), 0, aCksum);
  if( aCksum[0]!=h1.aCksum[0] || aCksum[1]!=h1.aCksum[1] ){
    return 1;   /* Checksum does not match */
  }

  if( memcmp(&pWal->hdr, &h1, sizeof(WalIndexHdr)) ){
    *pChanged = 1;
    memcpy(&pWal->hdr, &h1, sizeof(WalIndexHdr));
    pWal->szPage = (pWal->hdr.szPage&0xfe00) + ((pWal->hdr.szPage&0x0001)<<16);
    testcase( pWal->szPage<=32768 );
    testcase( pWal->szPage>=65536 );
  }

  /* The header was successfully read. Return zero. */
  return 0;
}